

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_predict.h
# Opt level: O2

void EntityRelationTask::update_example_indicies
               (bool param_1,example *ec,uint64_t mult_amount,uint64_t plus_amount)

{
  byte *pbVar1;
  unsigned_long *puVar2;
  example *__range1;
  byte *pbVar3;
  feature_index *idx;
  unsigned_long *puVar4;
  
  pbVar1 = (ec->super_example_predict).indices._end;
  for (pbVar3 = (ec->super_example_predict).indices._begin; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    puVar2 = (ec->super_example_predict).feature_space[*pbVar3].indicies._end;
    for (puVar4 = (ec->super_example_predict).feature_space[*pbVar3].indicies._begin;
        puVar4 != puVar2; puVar4 = puVar4 + 1) {
      *puVar4 = *puVar4 * mult_amount + plus_amount;
    }
  }
  return;
}

Assistant:

iterator end() { return iterator(feature_space, indices.end()); }